

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
* __thiscall
testing::internal::
FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
::FindOnCallSpec(FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                 *this,ArgumentTuple *args)

{
  OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *pOVar1;
  bool bVar2;
  pointer ppvVar3;
  MatchResultListener local_48;
  FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *local_38;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = this;
  do {
    if (ppvVar3 ==
        (local_38->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
              *)0x0;
    }
    pOVar1 = (OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
              *)ppvVar3[-1];
    local_48.stream_ = (ostream *)0x0;
    local_48._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
    bVar2 = MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>
            ::MatchAndExplain((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                               *)(pOVar1 + 0x10),
                              (span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L> *)args
                              ,&local_48);
    if (bVar2) {
      local_48.stream_ = (ostream *)0x0;
      local_48._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00197638;
      bVar2 = MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>_&>
              ::MatchAndExplain((MatcherBase<const_std::tuple<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_&>
                                 *)(pOVar1 + 0x28),args,&local_48);
    }
    else {
      bVar2 = false;
    }
    ppvVar3 = ppvVar3 + -1;
  } while (bVar2 == false);
  return pOVar1;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }